

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void EscapeParam(char *pDst,char *pSrc,int size)

{
  long lVar1;
  char cVar2;
  
  for (lVar1 = 0; (cVar2 = pSrc[lVar1], cVar2 != '\0' && ((int)lVar1 < size + -1));
      lVar1 = lVar1 + 1) {
    if ((cVar2 == '\\') || (cVar2 == '\"')) {
      *pDst = '\\';
      pDst = pDst + 1;
      cVar2 = pSrc[lVar1];
    }
    *pDst = cVar2;
    pDst = pDst + 1;
  }
  *pDst = '\0';
  return;
}

Assistant:

void EscapeParam(char *pDst, const char *pSrc, int size)
{
	for(int i = 0; *pSrc && i < size - 1; ++i)
	{
		if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
			*pDst++ = '\\';
		*pDst++ = *pSrc++;
	}
	*pDst = 0;
}